

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this,DecodeRawTransactionResponse *param_2)

{
  _func_int **pp_Var1;
  JsonClassBase<cfd::api::json::DecodeRawTransactionResponse> *in_RSI;
  JsonClassBase<cfd::api::json::DecodeRawTransactionResponse> *in_RDI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct> *pJVar2
  ;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  string *this_00;
  
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>::JsonClassBase(in_RDI,in_RSI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeRawTransactionResponse_009f7aa0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)(in_RSI + 7));
  this_00 = (string *)(in_RDI + 0xb);
  std::__cxx11::string::string(this_00,(string *)(in_RSI + 0xb));
  *(undefined4 *)&in_RDI[0x11]._vptr_JsonClassBase =
       *(undefined4 *)&in_RSI[0x11]._vptr_JsonClassBase;
  pp_Var1 = in_RSI[0x10]._vptr_JsonClassBase;
  in_RDI[0xf]._vptr_JsonClassBase = in_RSI[0xf]._vptr_JsonClassBase;
  in_RDI[0x10]._vptr_JsonClassBase = pp_Var1;
  pJVar2 = (JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
            *)(in_RDI + 0x12);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
  JsonObjectVector((JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
                    *)this_00,pJVar2);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  ::JsonObjectVector((JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                      *)this_00,
                     (JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                      *)pJVar2);
  return;
}

Assistant:

DecodeRawTransactionResponse() {
    CollectFieldName();
  }